

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceVkImpl.cpp
# Opt level: O1

void __thiscall
Diligent::RenderDeviceVkImpl::ExecuteAndDisposeTransientCmdBuff
          (RenderDeviceVkImpl *this,SoftwareQueueIndex CommandQueueId,VkCommandBuffer vkCmdBuff,
          CommandPoolWrapper *CmdPool)

{
  ulong uVar1;
  long *plVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  byte bVar4;
  VkResult VVar5;
  int iVar6;
  ICommandQueueVk *pIVar7;
  ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper> *this_00;
  CommandPoolWrapper *Args_1;
  ulong uVar8;
  pthread_mutex_t *__mutex;
  char (*Args_2) [2];
  long *plVar9;
  long *plVar10;
  long lVar11;
  string msg;
  string msg_4;
  TransientCmdPoolRecycler local_88;
  string local_58;
  Uint64 local_38;
  
  Args_1 = CmdPool;
  if (vkCmdBuff == (VkCommandBuffer)0x0) {
    FormatString<char[26],char[28]>
              ((string *)&local_88,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"vkCmdBuff != VK_NULL_HANDLE",(char (*) [28])CmdPool);
    Args_1 = (CommandPoolWrapper *)0x128;
    DebugAssertionFailed
              ((Char *)local_88.LogicalDevice,"ExecuteAndDisposeTransientCmdBuff",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderDeviceVkImpl.cpp"
               ,0x128);
    if (local_88.LogicalDevice != (VulkanLogicalDevice *)&local_88.Pool) {
      operator_delete(local_88.LogicalDevice,
                      (ulong)((long)&((local_88.Pool.m_pLogicalDevice.
                                       super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->
                                     super_enable_shared_from_this<VulkanUtilities::VulkanLogicalDevice>
                                     )._M_weak_this.
                                     super___weak_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + 1));
    }
  }
  VVar5 = (*vkEndCommandBuffer)(vkCmdBuff);
  if (VVar5 != VK_SUCCESS) {
    FormatString<char[29]>((string *)&local_88,(char (*) [29])"Failed to end command buffer");
    Args_1 = (CommandPoolWrapper *)0x12b;
    DebugAssertionFailed
              ((Char *)local_88.LogicalDevice,"ExecuteAndDisposeTransientCmdBuff",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderDeviceVkImpl.cpp"
               ,299);
    if (local_88.LogicalDevice != (VulkanLogicalDevice *)&local_88.Pool) {
      operator_delete(local_88.LogicalDevice,
                      (ulong)((long)&((local_88.Pool.m_pLogicalDevice.
                                       super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->
                                     super_enable_shared_from_this<VulkanUtilities::VulkanLogicalDevice>
                                     )._M_weak_this.
                                     super___weak_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + 1));
    }
  }
  if ((this->
      super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
      ).m_CmdQueueCount <= (ulong)CommandQueueId.m_Value) {
    FormatString<char[26],char[27]>
              ((string *)&local_88,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x80c319,
               (char (*) [27])Args_1);
    DebugAssertionFailed
              ((Char *)local_88.LogicalDevice,"LockCmdQueueAndRun",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineNextGenBase/include/RenderDeviceNextGenBase.hpp"
               ,0x107);
    if (local_88.LogicalDevice != (VulkanLogicalDevice *)&local_88.Pool) {
      operator_delete(local_88.LogicalDevice,
                      (ulong)((long)&((local_88.Pool.m_pLogicalDevice.
                                       super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->
                                     super_enable_shared_from_this<VulkanUtilities::VulkanLogicalDevice>
                                     )._M_weak_this.
                                     super___weak_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + 1));
    }
  }
  __mutex = (pthread_mutex_t *)
            ((this->
             super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
             ).m_CommandQueues + CommandQueueId.m_Value);
  iVar6 = pthread_mutex_lock(__mutex);
  if (iVar6 != 0) {
    std::__throw_system_error(iVar6);
  }
  local_38 = (**(code **)(**(long **)((long)__mutex + 0x30) + 0x38))
                       (*(long **)((long)__mutex + 0x30),vkCmdBuff);
  pthread_mutex_unlock(__mutex);
  pIVar7 = RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
           ::GetCommandQueue(&this->
                              super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                             ,CommandQueueId);
  iVar6 = (*(pIVar7->super_ICommandQueue).super_IObject._vptr_IObject[0xc])(pIVar7);
  local_88.LogicalDevice = (VulkanLogicalDevice *)CONCAT44(local_88.LogicalDevice._4_4_,iVar6);
  bVar4 = StaticCast<unsigned_char,unsigned_int>((uint *)&local_88);
  Args_2 = (char (*) [2])(this->m_TransientCmdPoolMgrs)._M_h._M_buckets;
  uVar1 = (this->m_TransientCmdPoolMgrs)._M_h._M_bucket_count;
  uVar8 = (ulong)bVar4 % uVar1;
  plVar9 = *(long **)(Args_2 + (uVar8 & 0xffffffff) * 4);
  plVar10 = (long *)0x0;
  if ((plVar9 != (long *)0x0) &&
     (plVar2 = (long *)*plVar9, plVar10 = plVar9, bVar4 != *(byte *)((long *)*plVar9 + 1))) {
    while (plVar9 = plVar2, plVar2 = (long *)*plVar9, plVar2 != (long *)0x0) {
      Args_2 = (char (*) [2])(ulong)*(byte *)(plVar2 + 1);
      plVar10 = (long *)0x0;
      if (((ulong)Args_2 % uVar1 != uVar8) || (plVar10 = plVar9, bVar4 == *(byte *)(plVar2 + 1)))
      goto LAB_00212d82;
    }
    plVar10 = (long *)0x0;
  }
LAB_00212d82:
  if (plVar10 == (long *)0x0) {
    lVar11 = 0;
  }
  else {
    lVar11 = *plVar10;
  }
  if (lVar11 == 0) {
    local_58._M_dataplus._M_p._0_4_ = (uint)bVar4;
    FormatString<char[70],unsigned_int,char[2]>
              ((string *)&local_88,
               (Diligent *)"Unable to find transient command pool manager for queue family index ",
               (char (*) [70])&local_58,(uint *)0x91f766,Args_2);
    DebugAssertionFailed
              ((Char *)local_88.LogicalDevice,"ExecuteAndDisposeTransientCmdBuff",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderDeviceVkImpl.cpp"
               ,0x185);
    if (local_88.LogicalDevice != (VulkanLogicalDevice *)&local_88.Pool) {
      operator_delete(local_88.LogicalDevice,
                      (ulong)((long)&((local_88.Pool.m_pLogicalDevice.
                                       super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->
                                     super_enable_shared_from_this<VulkanUtilities::VulkanLogicalDevice>
                                     )._M_weak_this.
                                     super___weak_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + 1));
    }
  }
  this_00 = RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
            ::GetReleaseQueue(&this->
                               super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                              ,CommandQueueId);
  local_88.LogicalDevice =
       (this->m_LogicalVkDevice).
       super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_88.CmdPoolMgr = (CommandPoolManager *)(lVar11 + 0x10);
  local_88.Pool.m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (CmdPool->m_pLogicalDevice).
         super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
  local_88.Pool.m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (CmdPool->m_pLogicalDevice).
       super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  (CmdPool->m_pLogicalDevice).
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (CmdPool->m_pLogicalDevice).
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_88.Pool.m_VkObject = CmdPool->m_VkObject;
  CmdPool->m_VkObject = (VkCommandPool_T *)0x0;
  local_88.vkCmdBuffer = vkCmdBuff;
  if (vkCmdBuff == (VkCommandBuffer)0x0 || local_88.Pool.m_VkObject == (VkCommandPool_T *)0x0) {
    FormatString<char[26],char[56]>
              (&local_58,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Pool != VK_NULL_HANDLE && vkCmdBuffer != VK_NULL_HANDLE",
               (char (*) [56])local_88.Pool.m_VkObject);
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"TransientCmdPoolRecycler",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderDeviceVkImpl.cpp"
               ,0x15d);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  local_58._M_dataplus._M_p = (pointer)operator_new(0x38);
  _Var3._M_pi = local_88.Pool.m_pLogicalDevice.
                super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  *(undefined ***)local_58._M_dataplus._M_p = &PTR__SpecificStaleResource_00aff5f0;
  *(VulkanLogicalDevice **)((long)local_58._M_dataplus._M_p + 8) = local_88.LogicalDevice;
  *(CommandPoolManager **)((long)local_58._M_dataplus._M_p + 0x10) = local_88.CmdPoolMgr;
  *(element_type **)((long)local_58._M_dataplus._M_p + 0x18) =
       local_88.Pool.m_pLogicalDevice.
       super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  *(long *)((long)local_58._M_dataplus._M_p + 0x20) = 0;
  local_88.Pool.m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_58._M_dataplus._M_p + 0x20) =
       _Var3._M_pi;
  local_88.Pool.m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  *(VkCommandPool_T **)((long)local_58._M_dataplus._M_p + 0x28) = local_88.Pool.m_VkObject;
  local_88.Pool.m_VkObject = (VkCommandPool_T *)0x0;
  *(VkCommandBuffer *)((long)local_58._M_dataplus._M_p + 0x30) = local_88.vkCmdBuffer;
  local_88.CmdPoolMgr = (CommandPoolManager *)0x0;
  local_88.vkCmdBuffer = (VkCommandBuffer)0x0;
  ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper>::DiscardResource
            (this_00,(DynamicStaleResourceWrapper *)&local_58,local_38);
  if ((long *)local_58._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_58._M_dataplus._M_p + 0x10))();
  }
  ExecuteAndDisposeTransientCmdBuff::TransientCmdPoolRecycler::~TransientCmdPoolRecycler(&local_88);
  return;
}

Assistant:

void RenderDeviceVkImpl::ExecuteAndDisposeTransientCmdBuff(SoftwareQueueIndex                    CommandQueueId,
                                                           VkCommandBuffer                       vkCmdBuff,
                                                           VulkanUtilities::CommandPoolWrapper&& CmdPool)
{
    VERIFY_EXPR(vkCmdBuff != VK_NULL_HANDLE);

    VkResult err = vkEndCommandBuffer(vkCmdBuff);
    DEV_CHECK_ERR(err == VK_SUCCESS, "Failed to end command buffer");
    (void)err;

    // We MUST NOT discard stale objects when executing transient command buffer,
    // otherwise a resource can be destroyed while still being used by the GPU:
    //
    //
    // Next Cmd Buff| Next Fence |        Immediate Context               |            This thread               |
    //              |            |                                        |                                      |
    //      N       |     F      |                                        |                                      |
    //              |            |  Draw(ResourceX)                       |                                      |
    //      N  -  - | -   -   -  |  Release(ResourceX)                    |                                      |
    //              |            |  - {N, ResourceX} -> Stale Objects     |                                      |
    //              |            |                                        |                                      |
    //              |            |                                        | SubmitCommandBuffer()                |
    //              |            |                                        | - SubmittedCmdBuffNumber = N         |
    //              |            |                                        | - SubmittedFenceValue = F            |
    //     N+1      |    F+1     |                                        | - DiscardStaleVkObjects(N, F)        |
    //              |            |                                        |   - {F, ResourceX} -> Release Queue  |
    //              |            |                                        |                                      |
    //     N+2 -   -|  - F+2  -  |  ExecuteCommandBuffer()                |                                      |
    //              |            |  - SubmitCommandBuffer()               |                                      |
    //              |            |  - ResourceX is already in release     |                                      |
    //              |            |    queue with fence value F, and       |                                      |
    //              |            |    F < SubmittedFenceValue==F+1        |                                      |
    //
    // Since transient command buffers do not count as real command buffers, submit them directly to the queue
    // to avoid interference with the command buffer counter
    Uint64 FenceValue = 0;
    LockCmdQueueAndRun(CommandQueueId,
                       [&](ICommandQueueVk* pCmdQueueVk) //
                       {
                           FenceValue = pCmdQueueVk->SubmitCmdBuffer(vkCmdBuff);
                       } //
    );

    class TransientCmdPoolRecycler
    {
    public:
        TransientCmdPoolRecycler(const VulkanUtilities::VulkanLogicalDevice& _LogicalDevice,
                                 CommandPoolManager&                         _CmdPoolMgr,
                                 VulkanUtilities::CommandPoolWrapper&&       _Pool,
                                 VkCommandBuffer&&                           _vkCmdBuffer) :
            // clang-format off
            LogicalDevice{_LogicalDevice         },
            CmdPoolMgr   {&_CmdPoolMgr           },
            Pool         {std::move(_Pool)       },
            vkCmdBuffer  {std::move(_vkCmdBuffer)}
        // clang-format on
        {
            VERIFY_EXPR(Pool != VK_NULL_HANDLE && vkCmdBuffer != VK_NULL_HANDLE);
            _vkCmdBuffer = VK_NULL_HANDLE;
        }

        // clang-format off
        TransientCmdPoolRecycler             (const TransientCmdPoolRecycler&)  = delete;
        TransientCmdPoolRecycler& operator = (const TransientCmdPoolRecycler&)  = delete;
        TransientCmdPoolRecycler& operator = (      TransientCmdPoolRecycler&&) = delete;

        TransientCmdPoolRecycler(TransientCmdPoolRecycler&& rhs) noexcept :
            LogicalDevice{rhs.LogicalDevice         },
            CmdPoolMgr   {rhs.CmdPoolMgr            },
            Pool         {std::move(rhs.Pool)       },
            vkCmdBuffer  {std::move(rhs.vkCmdBuffer)}
        {
            rhs.CmdPoolMgr  = nullptr;
            rhs.vkCmdBuffer = VK_NULL_HANDLE;
        }
        // clang-format on

        ~TransientCmdPoolRecycler()
        {
            if (CmdPoolMgr != nullptr)
            {
                LogicalDevice.FreeCommandBuffer(Pool, vkCmdBuffer);
                CmdPoolMgr->RecycleCommandPool(std::move(Pool));
            }
        }

    private:
        const VulkanUtilities::VulkanLogicalDevice& LogicalDevice;

        CommandPoolManager*                 CmdPoolMgr = nullptr;
        VulkanUtilities::CommandPoolWrapper Pool;
        VkCommandBuffer                     vkCmdBuffer = VK_NULL_HANDLE;
    };

    HardwareQueueIndex QueueFamilyIndex{GetCommandQueue(CommandQueueId).GetQueueFamilyIndex()};
    auto               CmdPoolMgrIter = m_TransientCmdPoolMgrs.find(QueueFamilyIndex);
    VERIFY(CmdPoolMgrIter != m_TransientCmdPoolMgrs.end(),
           "Unable to find transient command pool manager for queue family index ", Uint32{QueueFamilyIndex}, ".");

    // Discard command pool directly to the release queue since we know exactly which queue it was submitted to
    // as well as the associated FenceValue
    // clang-format off
    GetReleaseQueue(CommandQueueId).DiscardResource(
        TransientCmdPoolRecycler
        {
            GetLogicalDevice(),
            CmdPoolMgrIter->second,
            std::move(CmdPool),
            std::move(vkCmdBuff)
        },
        FenceValue);
    // clang-format on
}